

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,basic_string_view<char> value)

{
  basic_string_view<char> s;
  size_t in_RCX;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_RDX;
  format_specs *in_RSI;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_RDI;
  error_handler *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffd8;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *paVar1;
  
  if (in_RDI->specs_ == (format_specs *)0x0) {
    write(in_RDI,(int)in_RSI,in_RDX,in_RCX);
  }
  else {
    paVar1 = in_RDI;
    check_string_type_spec<char,fmt::v7::detail::error_handler>
              ((char)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffffa8);
    s.size_ = (size_t)paVar1;
    s.data_ = in_stack_ffffffffffffffd8;
    write<char>(in_RDX,s,in_RSI);
  }
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(basic_string_view<Char> value) {
    if (specs_) {
      check_string_type_spec(specs_->type, error_handler());
      write(value, *specs_);
    } else {
      write(value);
    }
    return out_;
  }